

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void lua_rawseti(lua_State *L,int idx,int n)

{
  TValue *pTVar1;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar2;
  uint64_t uVar3;
  TValue *pTVar4;
  GCobj *o;
  GCtab *t;
  
  pTVar4 = index2adr(L,idx);
  t = (GCtab *)(pTVar4->u64 & 0x7fffffffffff);
  if ((uint)n < t->asize) {
    pTVar4 = (TValue *)((long)n * 8 + (t->array).ptr64);
  }
  else {
    pTVar4 = lj_tab_setinth(L,t,n);
  }
  pTVar1 = L->top;
  aVar2 = pTVar1[-1].field_4;
  pTVar4->field_4 = aVar2;
  if (((((int)aVar2.it >> 0xf) + 0xdU < 9) &&
      ((*(byte *)(((ulong)aVar2 & 0x7fffffffffff) + 8) & 3) != 0)) && ((t->marked & 4) != 0)) {
    uVar3 = (L->glref).ptr64;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr64 = *(uint64_t *)(uVar3 + 0x40);
    *(GCtab **)(uVar3 + 0x40) = t;
  }
  L->top = pTVar1 + -1;
  return;
}

Assistant:

LUA_API void lua_rawseti(lua_State *L, int idx, int n)
{
  GCtab *t = tabV(index2adr(L, idx));
  TValue *dst, *src;
  lj_checkapi_slot(1);
  dst = lj_tab_setint(L, t, n);
  src = L->top-1;
  copyTV(L, dst, src);
  lj_gc_barriert(L, t, dst);
  L->top = src;
}